

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O1

void read_sei_payload(h264_stream_t *h,bs_t *b)

{
  sei_t *psVar1;
  uint8_t *puVar2;
  sei_scalability_info_t *psVar3;
  long lVar4;
  int iVar5;
  uint8_t uVar6;
  uint32_t r;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  bool bVar11;
  uint uVar7;
  
  psVar1 = h->sei;
  if (psVar1->payloadType == 0x18) {
    psVar3 = (sei_scalability_info_t *)calloc(1,0x6fa0c);
    (psVar1->field_2).sei_svc = psVar3;
    read_sei_scalability_info(h,b);
    return;
  }
  iVar5 = psVar1->payloadSize;
  psVar3 = (sei_scalability_info_t *)calloc(1,(long)iVar5);
  (psVar1->field_2).sei_svc = psVar3;
  if (0 < (long)iVar5) {
    lVar4 = 0;
    do {
      uVar8 = b->bits_left;
      if ((uVar8 == 8) && (puVar2 = b->p, puVar2 < b->end)) {
        uVar6 = *puVar2;
        b->p = puVar2 + 1;
      }
      else {
        pbVar9 = b->p;
        uVar7 = 0;
        iVar5 = 7;
        do {
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          uVar10 = 0;
          if (pbVar9 < b->end) {
            uVar10 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
          }
          if (uVar8 == 0) {
            pbVar9 = pbVar9 + 1;
            b->p = pbVar9;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar7 = uVar7 | uVar10 << ((byte)iVar5 & 0x1f);
          uVar6 = (uint8_t)uVar7;
          bVar11 = iVar5 != 0;
          iVar5 = iVar5 + -1;
        } while (bVar11);
      }
      *(uint8_t *)((long)((psVar1->field_2).sei_svc)->layers[0].roi + lVar4 + -0x4a) = uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 < psVar1->payloadSize);
  }
  return;
}

Assistant:

void read_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 1 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            read_sei_scalability_info( h, b );
            break;
        default:
            if( 1 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                s->data[i] = bs_read_u8(b);
    }
    
    //if( 1 )
    //    read_sei_end_bits(h, b);
}